

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

bool anon_unknown.dwarf_aa461::IsLoadAliasedWithStore
               (VmInstruction *loadInst,VmInstruction *storeInst)

{
  VmValue *pVVar1;
  VmValue *pVVar2;
  bool bVar3;
  VmValue **ppVVar4;
  VmConstant *pVVar5;
  VmConstant *pVVar6;
  VmConstant *storeOffset;
  VmValue *storeAddress;
  VmConstant *loadOffset;
  VmValue *loadAddress;
  VmInstruction *storeInst_local;
  VmInstruction *loadInst_local;
  
  ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&loadInst->arguments,0);
  pVVar1 = *ppVVar4;
  ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&loadInst->arguments,1);
  pVVar5 = getType<VmConstant>(*ppVVar4);
  ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&storeInst->arguments,0);
  pVVar2 = *ppVVar4;
  ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&storeInst->arguments,1);
  pVVar6 = getType<VmConstant>(*ppVVar4);
  if ((loadInst->cmd == VM_INST_LOAD_BYTE) && (storeInst->cmd == VM_INST_STORE_BYTE)) {
    if ((((pVVar1->type).structType == (TypeBase *)0x0) ||
        ((pVVar1->type).structType != (pVVar2->type).structType)) ||
       (pVVar5->iValue == pVVar6->iValue)) {
      loadInst_local._7_1_ = true;
    }
    else {
      loadInst_local._7_1_ = false;
    }
  }
  else if ((loadInst->cmd == VM_INST_LOAD_SHORT) && (storeInst->cmd == VM_INST_STORE_SHORT)) {
    if ((((pVVar1->type).structType == (TypeBase *)0x0) ||
        ((pVVar1->type).structType != (pVVar2->type).structType)) ||
       (pVVar5->iValue == pVVar6->iValue)) {
      loadInst_local._7_1_ = true;
    }
    else {
      loadInst_local._7_1_ = false;
    }
  }
  else if ((loadInst->cmd == VM_INST_LOAD_INT) && (storeInst->cmd == VM_INST_STORE_INT)) {
    if ((((pVVar1->type).structType == (TypeBase *)0x0) ||
        ((pVVar1->type).structType != (pVVar2->type).structType)) ||
       (pVVar5->iValue == pVVar6->iValue)) {
      loadInst_local._7_1_ = true;
    }
    else {
      loadInst_local._7_1_ = false;
    }
  }
  else if ((loadInst->cmd == VM_INST_LOAD_LONG) && (storeInst->cmd == VM_INST_STORE_LONG)) {
    if ((((pVVar1->type).structType == (TypeBase *)0x0) ||
        ((pVVar1->type).structType != (pVVar2->type).structType)) ||
       (pVVar5->iValue == pVVar6->iValue)) {
      loadInst_local._7_1_ = true;
    }
    else {
      loadInst_local._7_1_ = false;
    }
  }
  else if ((loadInst->cmd == VM_INST_LOAD_FLOAT) && (storeInst->cmd == VM_INST_STORE_FLOAT)) {
    if ((((pVVar1->type).structType == (TypeBase *)0x0) ||
        ((pVVar1->type).structType != (pVVar2->type).structType)) ||
       (pVVar5->iValue == pVVar6->iValue)) {
      loadInst_local._7_1_ = true;
    }
    else {
      loadInst_local._7_1_ = false;
    }
  }
  else if ((loadInst->cmd == VM_INST_LOAD_DOUBLE) && (storeInst->cmd == VM_INST_STORE_DOUBLE)) {
    if ((((pVVar1->type).structType == (TypeBase *)0x0) ||
        ((pVVar1->type).structType != (pVVar2->type).structType)) ||
       (pVVar5->iValue == pVVar6->iValue)) {
      loadInst_local._7_1_ = true;
    }
    else {
      loadInst_local._7_1_ = false;
    }
  }
  else {
    bVar3 = IsBuiltInStructLoadStore(loadInst);
    if ((bVar3) && (bVar3 = IsBuiltInStructLoadStore(storeInst), bVar3)) {
      if (((pVVar1->type).structType == (TypeBase *)0x0) ||
         (((pVVar1->type).structType != (pVVar2->type).structType ||
          (pVVar5->iValue == pVVar6->iValue)))) {
        loadInst_local._7_1_ = true;
      }
      else {
        loadInst_local._7_1_ = false;
      }
    }
    else if (loadInst->cmd == VM_INST_LOAD_STRUCT) {
      loadInst_local._7_1_ = true;
    }
    else if (storeInst->cmd == VM_INST_STORE_STRUCT) {
      loadInst_local._7_1_ = true;
    }
    else {
      loadInst_local._7_1_ = false;
    }
  }
  return loadInst_local._7_1_;
}

Assistant:

bool IsLoadAliasedWithStore(VmInstruction *loadInst, VmInstruction *storeInst)
	{
		VmValue *loadAddress = loadInst->arguments[0];
		VmConstant *loadOffset = getType<VmConstant>(loadInst->arguments[1]);

		VmValue *storeAddress = storeInst->arguments[0];
		VmConstant *storeOffset = getType<VmConstant>(storeInst->arguments[1]);

		if(loadInst->cmd == VM_INST_LOAD_BYTE && storeInst->cmd == VM_INST_STORE_BYTE)
		{
			if(loadAddress->type.structType && loadAddress->type.structType == storeAddress->type.structType)
			{
				if(loadOffset->iValue != storeOffset->iValue)
					return false;
			}

			return true;
		}

		if(loadInst->cmd == VM_INST_LOAD_SHORT && storeInst->cmd == VM_INST_STORE_SHORT)
		{
			if(loadAddress->type.structType && loadAddress->type.structType == storeAddress->type.structType)
			{
				if(loadOffset->iValue != storeOffset->iValue)
					return false;
			}

			return true;
		}

		if(loadInst->cmd == VM_INST_LOAD_INT && storeInst->cmd == VM_INST_STORE_INT)
		{
			if(loadAddress->type.structType && loadAddress->type.structType == storeAddress->type.structType)
			{
				if(loadOffset->iValue != storeOffset->iValue)
					return false;
			}

			return true;
		}

		if(loadInst->cmd == VM_INST_LOAD_LONG && storeInst->cmd == VM_INST_STORE_LONG)
		{
			if(loadAddress->type.structType && loadAddress->type.structType == storeAddress->type.structType)
			{
				if(loadOffset->iValue != storeOffset->iValue)
					return false;
			}

			return true;
		}

		if(loadInst->cmd == VM_INST_LOAD_FLOAT && storeInst->cmd == VM_INST_STORE_FLOAT)
		{
			if(loadAddress->type.structType && loadAddress->type.structType == storeAddress->type.structType)
			{
				if(loadOffset->iValue != storeOffset->iValue)
					return false;
			}

			return true;
		}

		if(loadInst->cmd == VM_INST_LOAD_DOUBLE && storeInst->cmd == VM_INST_STORE_DOUBLE)
		{
			if(loadAddress->type.structType && loadAddress->type.structType == storeAddress->type.structType)
			{
				if(loadOffset->iValue != storeOffset->iValue)
					return false;
			}

			return true;
		}

		if(IsBuiltInStructLoadStore(loadInst) && IsBuiltInStructLoadStore(storeInst))
		{
			if(loadAddress->type.structType && loadAddress->type.structType == storeAddress->type.structType)
			{
				if(loadOffset->iValue != storeOffset->iValue)
					return false;
			}

			return true;
		}

		// Small store can overwrite struct memory
		if(loadInst->cmd == VM_INST_LOAD_STRUCT)
			return true;

		// Struct store can overwrite other types
		if(storeInst->cmd == VM_INST_STORE_STRUCT)
			return true;

		return false;
	}